

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O3

void Abc_FlowRetime_FreeTiming(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  void **__ptr;
  MinRegMan_t *pMVar3;
  Vec_Ptr_t *pVVar4;
  
  pVVar4 = pManMR->vExactNodes;
  iVar1 = pVVar4->nSize;
  pMVar3 = pManMR;
  while( true ) {
    pManMR = pMVar3;
    if (iVar1 == 0) {
      if (pVVar4->pArray != (void **)0x0) {
        free(pVVar4->pArray);
      }
      free(pVVar4);
      if (pManMR->vTimeEdges != (Vec_Ptr_t *)0x0) {
        free(pManMR->vTimeEdges);
        pManMR->vTimeEdges = (Vec_Ptr_t *)0x0;
      }
      return;
    }
    if (iVar1 < 1) break;
    pVVar4->nSize = iVar1 - 1U;
    uVar2 = *(uint *)((long)pVVar4->pArray[iVar1 - 1U] + 0x10);
    if (pMVar3->vTimeEdges[uVar2].nSize != 0) {
      pVVar4 = pMVar3->vTimeEdges + uVar2;
      __ptr = pVVar4->pArray;
      pVVar4->nCap = 0;
      pVVar4->nSize = 0;
      pVVar4->pArray = (void **)0x0;
      if (__ptr != (void **)0x0) {
        free(__ptr);
      }
    }
    pVVar4 = pManMR->vExactNodes;
    iVar1 = pVVar4->nSize;
    pMVar3 = pManMR;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
}

Assistant:

void Abc_FlowRetime_FreeTiming( Abc_Ntk_t *pNtk ) {
  Abc_Obj_t *pObj;
  void *pArray;

  while( Vec_PtrSize( pManMR->vExactNodes )) {
    pObj = (Abc_Obj_t*)Vec_PtrPop( pManMR->vExactNodes );
    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  }

  Vec_PtrFree(pManMR->vExactNodes);
  ABC_FREE( pManMR->vTimeEdges );
}